

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QAbstractAnimation_*>::relocate
          (QArrayDataPointer<QAbstractAnimation_*> *this,qsizetype offset,QAbstractAnimation ***data
          )

{
  bool bVar1;
  QAbstractAnimation **first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  QAbstractAnimation **res;
  
  first = (QAbstractAnimation **)(*(long *)(in_RDI + 8) + in_RSI * 8);
  QtPrivate::q_relocate_overlap_n<QAbstractAnimation*,long_long>
            (first,in_RDI,(QAbstractAnimation **)0x678cd7);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QAbstractAnimation*>,QAbstractAnimation*const*>
                        (data,(QArrayDataPointer<QAbstractAnimation_*> *)res), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  *(QAbstractAnimation ***)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }